

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O0

void __thiscall
QTextDocumentPrivate::setLayout(QTextDocumentPrivate *this,QAbstractTextDocumentLayout *layout)

{
  bool bVar1;
  int iVar2;
  QTextDocument *pQVar3;
  QTextBlockData *this_00;
  QAbstractTextDocumentLayout *in_RSI;
  BlockMap *__ptr;
  QTextDocumentPrivate *in_RDI;
  long in_FS_OFFSET;
  bool firstLayout;
  QTextDocument *q;
  QScopedValueRollback<bool> bg;
  Iterator it;
  QTextDocument *in_stack_ffffffffffffff98;
  QAbstractTextDocumentLayout *pQVar4;
  Iterator *in_stack_ffffffffffffffa0;
  QAbstractTextDocumentLayout *this_01;
  undefined1 local_28 [16];
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = q_func(in_RDI);
  iVar2 = (int)((ulong)pQVar3 >> 0x20);
  if (in_RDI->lout != in_RSI) {
    pQVar4 = in_RDI->lout;
    this_01 = in_RDI->lout;
    if (this_01 != (QAbstractTextDocumentLayout *)0x0) {
      (**(code **)(*(long *)this_01 + 0x20))();
    }
    in_RDI->lout = in_RSI;
    if (pQVar4 != (QAbstractTextDocumentLayout *)0x0) {
      local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      __ptr = &in_RDI->blocks;
      QFragmentMap<QTextBlockData>::begin((QFragmentMap<QTextBlockData> *)this_01);
      while (bVar1 = QFragmentMap<QTextBlockData>::Iterator::atEnd((Iterator *)local_18),
            ((bVar1 ^ 0xffU) & 1) != 0) {
        this_00 = QFragmentMap<QTextBlockData>::Iterator::operator->((Iterator *)0x7d1508);
        QTextBlockData::free(this_00,__ptr);
        QFragmentMap<QTextBlockData>::Iterator::operator++(in_stack_ffffffffffffffa0);
      }
    }
    QTextDocument::documentLayoutChanged((QTextDocument *)0x7d1528);
    local_28._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QScopedValueRollback<bool>::QScopedValueRollback
              ((QScopedValueRollback<bool> *)in_stack_ffffffffffffffa0,
               (bool *)in_stack_ffffffffffffff98,SUB81((ulong)this_01 >> 0x38,0));
    length((QTextDocumentPrivate *)0x7d156f);
    QTextDocument::contentsChange
              (in_stack_ffffffffffffff98,(int)((ulong)this_01 >> 0x20),(int)this_01,iVar2);
    QScopedValueRollback<bool>::~QScopedValueRollback((QScopedValueRollback<bool> *)local_28);
    if (in_RDI->lout != (QAbstractTextDocumentLayout *)0x0) {
      pQVar4 = in_RDI->lout;
      iVar2 = length((QTextDocumentPrivate *)0x7d15ad);
      (**(code **)(*(long *)pQVar4 + 0x90))(pQVar4,0,0,iVar2);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextDocumentPrivate::setLayout(QAbstractTextDocumentLayout *layout)
{
    Q_Q(QTextDocument);
    if (lout == layout)
        return;
    const bool firstLayout = !lout;
    delete lout;
    lout = layout;

    if (!firstLayout)
        for (BlockMap::Iterator it = blocks.begin(); !it.atEnd(); ++it)
            it->free();

    emit q->documentLayoutChanged();
    {
        QScopedValueRollback<bool> bg(inContentsChange, true);
        emit q->contentsChange(0, 0, length());
    }
    if (lout)
        lout->documentChanged(0, 0, length());
}